

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::releaseColorPicking(QColorDialogPrivate *this)

{
  long lVar1;
  QObject *pQVar2;
  QColorDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QColorDialog *q;
  undefined1 in_stack_ffffffffffffff9f;
  QColorPicker *in_stack_ffffffffffffffa0;
  QWidget *this_01;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  QColorDialogPrivate *pQVar5;
  QLabel *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  pQVar2 = (QObject *)q_func(in_RDI);
  QtPrivate::QColorPicker::setCrossVisible
            (in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  QObject::removeEventFilter(pQVar2);
  QWidget::releaseMouse((QWidget *)0x737bb8);
  QWidget::releaseKeyboard((QWidget *)in_stack_ffffffffffffffa0);
  uVar4 = 0;
  QWidget::setMouseTracking((QWidget *)in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  this_01 = (QWidget *)in_RDI->lblScreenColorInfo;
  QVar3 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffa8,(size_t)this_01);
  this_00 = (QLabel *)QVar3.m_size;
  QVar3.m_data = (char *)pQVar5;
  QVar3.m_size = (qsizetype)pQVar2;
  QString::QString((QString *)in_RDI,QVar3);
  QLabel::setText(this_00,(QString *)CONCAT44(uVar4,in_stack_ffffffffffffffb8));
  QString::~QString((QString *)0x737c30);
  QWidget::setDisabled(this_01,(bool)in_stack_ffffffffffffff9f);
  QWidget::setDisabled(this_01,(bool)in_stack_ffffffffffffff9f);
  QWidget::setDisabled(this_01,(bool)in_stack_ffffffffffffff9f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::releaseColorPicking()
{
    Q_Q(QColorDialog);
    cp->setCrossVisible(true);
    q->removeEventFilter(colorPickingEventFilter);
    q->releaseMouse();
#ifdef Q_OS_WIN32
    updateTimer->stop();
    dummyTransparentWindow.setVisible(false);
#endif
    q->releaseKeyboard();
    q->setMouseTracking(false);
    lblScreenColorInfo->setText("\n"_L1);
    addCusBt->setDisabled(false);
    buttons->setDisabled(false);
    eyeDropperButton->setDisabled(false);
}